

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O3

void __thiscall
ParserTest_StripTrailingSpace_Test::TestBody(ParserTest_StripTrailingSpace_Test *this)

{
  bool bVar1;
  char *in_RDX;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  string local_38;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  (anonymous_namespace)::Parse_abi_cxx11_(&local_38,(_anonymous_namespace_ *)"test \t",in_RDX);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_18,"\"<p>test</p>\"","Parse(\"test \\t\")",(char (*) [12])"<p>test</p>",&local_38
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x7b,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ParserTest, StripTrailingSpace) {
  EXPECT_EQ("<p>test</p>", Parse("test \t"));
}